

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3PExprAddSelect(Parse *pParse,Expr *pExpr,Select *pSelect)

{
  if (pExpr != (Expr *)0x0) {
    (pExpr->x).pSelect = pSelect;
    pExpr->flags = pExpr->flags | 0x200800;
    sqlite3ExprSetHeightAndFlags(pParse,pExpr);
    return;
  }
  if (pSelect != (Select *)0x0) {
    clearSelect(pParse->db,pSelect,1);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3PExprAddSelect(Parse *pParse, Expr *pExpr, Select *pSelect){
  if( pExpr ){
    pExpr->x.pSelect = pSelect;
    ExprSetProperty(pExpr, EP_xIsSelect|EP_Subquery);
    sqlite3ExprSetHeightAndFlags(pParse, pExpr);
  }else{
    assert( pParse->db->mallocFailed );
    sqlite3SelectDelete(pParse->db, pSelect);
  }
}